

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh2.c
# Opt level: O2

void Bmc_MeshTest2(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  sat_solver *s;
  undefined4 extraout_var;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  abctime aVar15;
  undefined4 in_register_0000000c;
  int (*paiVar16) [102];
  long lVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  abctime time;
  abctime time_00;
  int iVar21;
  int iVar22;
  int (*paiVar23) [102];
  long lVar24;
  lit *plVar25;
  uint uVar26;
  char *pcVar27;
  char *__format;
  uint uVar28;
  int iVar29;
  int *__s;
  int (*paiVar30) [102];
  long lVar31;
  undefined8 uVar32;
  int Lit;
  int (*local_a908) [102];
  undefined8 local_a900;
  int local_a8f4;
  int (*local_a8f0) [102];
  ulong local_a8e8;
  ulong local_a8e0;
  ulong local_a8d8;
  int local_a8cc;
  ulong local_a8c8;
  ulong local_a8c0;
  uint local_a8b4;
  ulong local_a8b0;
  ulong local_a8a8;
  ulong local_a8a0;
  int (*local_a898) [102];
  ulong local_a890;
  ulong local_a888;
  long local_a880;
  int (*local_a878) [102];
  ulong local_a870;
  ulong local_a868;
  int local_a85c;
  int iGVars [4];
  int iTVars [4];
  uint local_a828;
  int pLits [100];
  int pN [102] [2];
  int Me [102] [102];
  
  local_a900 = CONCAT44(in_register_0000000c,T);
  uVar11 = (ulong)(uint)X;
  local_a8cc = fVerbose;
  aVar10 = Abc_Clock();
  s = sat_solver_new();
  __s = Me[0];
  memset(__s,0,0xa290);
  memset(pN,0,0x330);
  local_a8c8 = CONCAT44(local_a8c8._4_4_,p->vCis->nSize);
  local_a8f4 = p->nRegs;
  iVar2 = Gia_ManAndNum(p);
  local_a8c0 = CONCAT44(extraout_var,iVar2);
  local_a8b0 = uVar11;
  if (((X < 0x65) && (Y < 0x65)) && ((int)local_a900 < 0x65)) {
    uVar28 = (int)local_a8c8 - local_a8f4;
    local_a8e8 = (ulong)uVar28;
    uVar3 = iVar2 + uVar28;
    local_a8d8 = (ulong)uVar3;
    if ((int)uVar3 < 0x65) {
      uVar11 = 0;
      local_a888 = 0;
      if (0 < (int)uVar28) {
        local_a888 = (ulong)uVar28;
      }
      for (; local_a888 != uVar11; uVar11 = uVar11 + 1) {
        pN[uVar11] = (int  [2])0xffffffffffffffff;
      }
      uVar12 = 0;
      uVar11 = (ulong)(uint)p->nObjs;
      if (p->nObjs < 1) {
        uVar11 = uVar12;
      }
      lVar20 = -1;
      while ((uVar11 * 0xc - uVar12 != 0 && (p->pObjs != (Gia_Obj_t *)0x0))) {
        uVar32 = *(undefined8 *)(&p->pObjs->field_0x0 + uVar12);
        uVar26 = (uint)uVar32;
        if ((~uVar26 & 0x1fffffff) != 0 && -1 < (int)uVar26) {
          pN[lVar20][0] = (int)lVar20 - (uVar26 & 0x1fffffff);
          pN[lVar20][1] = (int)lVar20 - ((uint)((ulong)uVar32 >> 0x20) & 0x1fffffff);
        }
        uVar12 = uVar12 + 0xc;
        lVar20 = lVar20 + 1;
      }
      if (local_a8cc != 0) {
        lVar20 = (long)(int)uVar28;
        printf("The graph has %d inputs: ");
        uVar11 = local_a888 & 0xffffffff;
        iVar2 = 0;
        while (iVar19 = (int)uVar11, uVar11 = (ulong)(iVar19 - 1), iVar19 != 0) {
          printf("%c ",(ulong)(iVar2 + 0x61));
          iVar2 = iVar2 + 1;
        }
        uVar28 = Gia_ManAndNum(p);
        printf("  and %d nodes: ",(ulong)uVar28);
        uVar28 = ((int)local_a8c8 - local_a8f4) + 0x61;
        for (; lVar20 < (int)uVar3; lVar20 = lVar20 + 1) {
          printf("%c=%c%c ",(ulong)uVar28,(ulong)(pN[lVar20][0] + 0x61));
          uVar28 = uVar28 + 1;
        }
        putchar(10);
      }
      uVar28 = (uint)local_a900;
      Me[0x65][0x65] = (int)local_a8d8;
      uVar11 = 0;
      iVar2 = (int)local_a8b0;
      paiVar23 = (int (*) [102])0x0;
      if (0 < iVar2) {
        paiVar23 = (int (*) [102])(local_a8b0 & 0xffffffff);
      }
      local_a890 = 0;
      if (0 < Y) {
        local_a890 = (ulong)(uint)Y;
      }
      uVar12 = 0;
      for (; uVar11 != local_a890; uVar11 = uVar11 + 1) {
        for (lVar20 = 0; (long)paiVar23 * 0x198 - lVar20 != 0; lVar20 = lVar20 + 0x198) {
          *(int *)((long)__s + lVar20) = (int)uVar12;
          uVar12 = (ulong)((int)uVar12 + uVar28 + Me[0x65][0x65] + 0x11);
        }
        __s = __s + 1;
      }
      Me[0x65][100] = uVar28;
      if (local_a8cc != 0) {
        printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
               ,uVar12,(ulong)(Y * iVar2 * uVar28));
      }
      local_a898 = (int (*) [102])(ulong)(iVar2 - 1);
      local_a8a0 = (ulong)(Y - 1);
      paiVar16 = (int (*) [102])0x0;
      local_a8b4 = 0;
      if (0 < (int)uVar28) {
        local_a8b4 = uVar28;
      }
      local_a878 = paiVar23;
      while (paiVar16 != local_a878) {
        local_a908 = Me + (long)paiVar16;
        local_a8f0 = paiVar16;
        for (uVar11 = 0; uVar11 != local_a890; uVar11 = uVar11 + 1) {
          iVar2 = (*local_a908)[uVar11];
          if ((local_a8f0 == (int (*) [102])0x0) ||
             (uVar11 == local_a8a0 || (uVar11 == 0 || local_a8f0 == local_a898))) {
            iVar19 = (int)local_a900;
            uVar28 = 0;
            while (uVar12 = local_a8e8, local_a8b4 != uVar28) {
              Lit = Abc_Var2Lit(iVar2 + uVar28,(uint)(uVar28 != 0));
              iVar4 = sat_solver_addclause(s,&Lit,(lit *)&local_a908);
              uVar28 = uVar28 + 1;
              if (iVar4 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                              ,0xac,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
            }
            while( true ) {
              iVar4 = (int)uVar12;
              if ((int)local_a8d8 <= iVar4) break;
              Lit = Abc_Var2Lit(iVar2 + iVar19 + iVar4,1);
              iVar5 = sat_solver_addclause(s,&Lit,(lit *)&local_a908);
              uVar12 = (ulong)(iVar4 + 1);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                              ,0xb2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
            }
          }
          else {
            Lit = Abc_Var2Lit(iVar2,1);
            iVar2 = sat_solver_addclause(s,&Lit,(lit *)&local_a908);
            if (iVar2 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0xb8,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
          }
        }
        paiVar16 = (int (*) [102])((long)*local_a8f0 + 1);
      }
      iVar2 = (int)local_a8d8;
      iVar19 = (int)local_a900;
      local_a8e0 = 0;
      local_a868 = 0;
      if (0 < iVar2) {
        local_a868 = local_a8d8 & 0xffffffff;
      }
      local_a85c = (int)local_a888 * 0xc + (int)local_a868 * 8;
      lVar13 = (long)(int)local_a8e8;
      lVar14 = (long)(int)local_a8a0;
      local_a880 = (long)(int)local_a898;
      uVar28 = ((int)local_a8c0 + (int)local_a8c8 + iVar19) - local_a8f4;
      local_a8c0 = (ulong)uVar28;
      iVar4 = uVar28 + 4;
      lVar20 = 1;
      uVar11 = local_a8d8;
      while (lVar17 = lVar20, lVar17 < local_a880) {
        lVar24 = 1;
        while (lVar20 = lVar17 + 1, lVar24 < lVar14) {
          local_a8a8 = (ulong)(uint)Me[lVar17][lVar24];
          iVar5 = (int)local_a900;
          uVar28 = Me[lVar17][lVar24] + iVar5;
          uVar11 = (ulong)uVar28;
          iVar21 = uVar28 + iVar2 + 0x10;
          iTVars[0] = Me[lVar17 + -1][lVar24];
          iGVars[0] = Me[lVar17 + -1][lVar24] + iVar5;
          iTVars[1] = Me[lVar17 + -1][lVar24 + 0x65];
          iGVars[1] = Me[lVar17 + -1][lVar24 + 0x65] + iVar5;
          iTVars[2] = Me[lVar17 + 1][lVar24];
          iGVars[2] = Me[lVar17 + 1][lVar24] + iVar5;
          iTVars[3] = Me[lVar17][lVar24 + 1];
          lVar24 = lVar24 + 1;
          iGVars[3] = iTVars[3] + iVar5;
          local_a8e0 = (ulong)(uint)((int)local_a8e0 + (int)local_a868);
          uVar12 = local_a868 & 0xffffffff;
          local_a870 = uVar11;
          while (iVar5 = (int)uVar12, uVar12 = (ulong)(iVar5 - 1), iVar5 != 0) {
            pLits[0] = Abc_Var2Lit((int)uVar11,1);
            pLits[1] = Abc_Var2Lit(iVar21,0);
            iVar5 = sat_solver_addclause(s,pLits,pLits + 2);
            uVar11 = (ulong)((int)uVar11 + 1);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0xda,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
          }
          pLits[0] = Abc_Var2Lit(iVar21,1);
          for (lVar20 = 1; lVar20 < iVar19; lVar20 = lVar20 + 1) {
            iVar5 = Abc_Var2Lit((int)local_a8a8 + (int)lVar20,0);
            pLits[lVar20] = iVar5;
          }
          iVar5 = sat_solver_addclause(s,pLits,pLits + iVar19);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                          ,0xe2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
          }
          pLits[0] = Abc_Var2Lit(iVar21,1);
          iVar5 = (int)local_a8c0;
          iVar21 = (int)local_a8a8;
          for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 1) {
            iVar6 = Abc_Var2Lit(iVar5 + iVar21 + (int)lVar20,0);
            pLits[lVar20 + 1] = iVar6;
          }
          iVar5 = sat_solver_addclause(s,pLits,pLits + 0x11);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                          ,0xe9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
          }
          local_a8e0 = (ulong)((int)local_a8e0 + 2);
          iVar21 = (int)local_a8c0;
          iVar6 = (int)local_a8a8;
          local_a8c8 = (ulong)(uint)(iVar4 + iVar6);
          for (iVar5 = 1; uVar11 = local_a8d8, iVar5 < (int)local_a900; iVar5 = iVar5 + 1) {
            iVar22 = iVar5 + (int)local_a8a8;
            local_a8f4 = iVar5 + -1;
            paiVar16 = (int (*) [102])0x0;
            while( true ) {
              if ((int)paiVar16 == (int)local_a868) break;
              local_a908 = (int (*) [102])CONCAT44(local_a908._4_4_,(int)local_a870 + (int)paiVar16)
              ;
              lVar20 = 0;
              local_a8f0 = paiVar16;
              while (lVar20 != 4) {
                pLits[0] = Abc_Var2Lit(iVar22,1);
                iVar8 = (int)local_a908;
                pLits[1] = Abc_Var2Lit((int)local_a908,1);
                iVar29 = iVar21 + iVar6 + (int)lVar20;
                pLits[2] = Abc_Var2Lit(iVar29,1);
                pLits[3] = Abc_Var2Lit(iTVars[lVar20] + local_a8f4,0);
                iVar7 = sat_solver_addclause(s,pLits,pLits + 4);
                if (iVar7 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0xf9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(iVar22,1);
                pLits[1] = Abc_Var2Lit(iVar8,1);
                pLits[2] = Abc_Var2Lit(iVar29,1);
                paiVar16 = local_a8f0;
                pLits[3] = Abc_Var2Lit(iGVars[lVar20] + (int)local_a8f0,0);
                iVar8 = sat_solver_addclause(s,pLits,pLits + 4);
                lVar20 = lVar20 + 1;
                if (iVar8 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x100,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
              }
              paiVar16 = (int (*) [102])(ulong)((int)paiVar16 + 1);
            }
            local_a8e0 = (ulong)(uint)((int)local_a8e0 + local_a85c);
            local_a8e8 = CONCAT44(local_a8e8._4_4_,iVar22);
            for (iVar8 = 0; iVar8 != (int)local_a888; iVar8 = iVar8 + 1) {
              iVar22 = (int)local_a870;
              iVar7 = 0;
              while (iVar7 != 0xc) {
                pLits[0] = Abc_Var2Lit(iVar8 + iVar22,1);
                pLits[1] = Abc_Var2Lit((int)local_a8c8 + iVar7,1);
                iVar29 = sat_solver_addclause(s,pLits,pLits + 2);
                iVar7 = iVar7 + 1;
                if (iVar29 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x109,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
              }
              iVar22 = (int)local_a8e8;
            }
            for (lVar20 = lVar13; lVar20 < (int)uVar3; lVar20 = lVar20 + 1) {
              iVar8 = pN[lVar20][0];
              local_a8e0 = (ulong)((int)local_a8e0 + 0x30);
              local_a908 = (int (*) [102])CONCAT44(local_a908._4_4_,(int)local_a870 + (int)lVar20);
              lVar31 = 0;
              while (lVar31 != 0xc) {
                if (iVar8 < 0) {
LAB_0048ac3c:
                  __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x110,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
                iVar7 = pN[lVar20][1];
                if ((long)iVar7 < 0) goto LAB_0048ac3c;
                if ((lVar20 <= iVar8) || (lVar20 <= iVar7)) {
                  __assert_fail("pN[g][0] < g && pN[g][1] < g",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x111,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(iVar22,1);
                pLits[1] = Abc_Var2Lit((int)local_a908,1);
                local_a8f0 = (int (*) [102])(local_a8c8 + lVar31);
                pLits[2] = Abc_Var2Lit((int)local_a8f0,1);
                iVar22 = local_a8f4;
                iVar29 = (&DAT_007ee720)[lVar31 * 2];
                pLits[3] = Abc_Var2Lit(iTVars[iVar29] + local_a8f4,0);
                plVar25 = pLits + 4;
                iVar9 = sat_solver_addclause(s,pLits,plVar25);
                if (iVar9 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x118,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit((int)local_a8e8,1);
                pLits[1] = Abc_Var2Lit((int)local_a908,1);
                pLits[2] = Abc_Var2Lit((int)local_a8f0,1);
                iVar9 = (&DAT_007ee724)[lVar31 * 2];
                pLits[3] = Abc_Var2Lit(iTVars[iVar9] + iVar22,0);
                iVar22 = sat_solver_addclause(s,pLits,plVar25);
                if (iVar22 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x11f,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
                iVar22 = (int)local_a8e8;
                pLits[0] = Abc_Var2Lit((int)local_a8e8,1);
                pLits[1] = Abc_Var2Lit((int)local_a908,1);
                pLits[2] = Abc_Var2Lit((int)local_a8f0,1);
                pLits[3] = Abc_Var2Lit(iGVars[iVar29] + iVar8,0);
                iVar29 = sat_solver_addclause(s,pLits,plVar25);
                if (iVar29 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x127,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
                pLits[0] = Abc_Var2Lit(iVar22,1);
                pLits[1] = Abc_Var2Lit((int)local_a908,1);
                pLits[2] = Abc_Var2Lit((int)local_a8f0,1);
                pLits[3] = Abc_Var2Lit(iVar7 + iGVars[iVar9],0);
                iVar7 = sat_solver_addclause(s,pLits,plVar25);
                lVar31 = lVar31 + 1;
                if (iVar7 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                                ,0x12e,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
              }
            }
          }
        }
      }
      Lit = Abc_Var2Lit((int)local_a900 + Me[1][1] + (int)uVar11 + -1,0);
      plVar25 = &Lit;
      iVar2 = sat_solver_addclause(s,plVar25,(lit *)&local_a908);
      if (iVar2 == 0) {
        printf("Problem has no solution. ");
        aVar15 = Abc_Clock();
        Abc_PrintTime((int)aVar15 - (int)aVar10,(char *)plVar25,time);
      }
      else {
        if (local_a8cc == 0) goto LAB_0048aec6;
        pcVar27 = "Finished adding %d clauses. Started solving...\n";
        while( true ) {
          printf(pcVar27);
LAB_0048aec6:
          iVar19 = (int)uVar11;
          uVar32 = 0;
          pcVar27 = (char *)0x0;
          iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
          if (iVar2 != 1) {
            __format = "Problem has no solution. ";
            if (iVar2 != -1) {
              if (iVar2 != 0) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                              ,0x159,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
              __format = "Computation timed out. ";
            }
            goto LAB_0048b016;
          }
          local_a8e8 = CONCAT44(local_a8e8._4_4_,1);
          paiVar16 = Me;
          iVar2 = 0;
          for (paiVar30 = (int (*) [102])0x0; iVar19 = (int)uVar11, paiVar30 != local_a878;
              paiVar30 = (int (*) [102])((long)*paiVar30 + 1)) {
            local_a908 = paiVar30;
            local_a8f0 = paiVar16;
            for (uVar12 = 0; local_a890 != uVar12; uVar12 = uVar12 + 1) {
              if ((paiVar30 == (int (*) [102])0x0) ||
                 (local_a8a0 == uVar12 || (uVar12 == 0 || paiVar30 == local_a898))) {
                uVar3 = (*paiVar16)[uVar12] + (int)local_a900;
                iVar19 = uVar3 + (int)uVar11;
              }
              else {
                iVar21 = (*paiVar16)[uVar12] + (int)local_a900;
                uVar3 = iVar21 + (int)uVar11;
                iVar19 = Bmc_MeshAddOneHotness2(s,(*paiVar16)[uVar12],iVar21);
                iVar5 = Bmc_MeshAddOneHotness2(s,iVar21,uVar3);
                iVar2 = iVar5 + iVar19 + iVar2;
                iVar19 = (int)local_a8d8 + iVar21 + 0x10;
                paiVar16 = local_a8f0;
                paiVar30 = local_a908;
                uVar11 = local_a8d8;
              }
              pcVar27 = (char *)(ulong)uVar3;
              iVar19 = Bmc_MeshAddOneHotness2(s,uVar3,iVar19);
              iVar2 = iVar19 + iVar2;
            }
            paiVar16 = paiVar16 + 1;
          }
          if (iVar2 < 1) break;
          pcVar27 = "Adding %d one-hotness clauses.\n";
        }
        __format = "Satisfying solution found. ";
        iVar2 = (int)local_a8e8;
LAB_0048b016:
        iVar5 = 0;
        printf(__format);
        aVar15 = Abc_Clock();
        Abc_PrintTime((int)aVar15 - (int)aVar10,pcVar27,time_00);
        if (iVar2 == 1) {
          uVar12 = (ulong)(uint)(iVar19 + (int)local_a900);
          uVar3 = 0;
          lVar20 = local_a880;
          uVar18 = local_a900;
          uVar11 = local_a8b0;
          local_a8d8 = uVar12;
          for (paiVar16 = (int (*) [102])0x1; (long)paiVar16 < lVar14;
              paiVar16 = (int (*) [102])((long)*paiVar16 + 1)) {
            local_a908 = paiVar16;
            for (lVar13 = 1; lVar13 < lVar20; lVar13 = lVar13 + 1) {
              iVar2 = Me[lVar13][(long)paiVar16];
              for (iVar19 = 0; paiVar16 = local_a908, iVar19 != 4; iVar19 = iVar19 + 1) {
                iVar21 = Bmc_MeshVarValue2(s,(int)uVar12 + iVar2 + iVar19);
                iVar5 = iVar5 + iVar21;
              }
              for (iVar19 = 0; iVar19 != 0xc; iVar19 = iVar19 + 1) {
                iVar21 = Bmc_MeshVarValue2(s,iVar19 + iVar2 + iVar4);
                uVar3 = uVar3 + iVar21;
              }
              lVar20 = local_a880;
              uVar18 = local_a900;
              uVar11 = local_a8b0;
              uVar12 = local_a8d8;
            }
          }
          printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n"
                 ,uVar11,(ulong)(uint)Y,uVar18,(ulong)(uVar3 + iVar5),(ulong)uVar3,
                 CONCAT44((int)((ulong)uVar32 >> 0x20),iVar5));
          printf(" Y\\X ");
          for (uVar3 = 0; local_a828 = (uint)paiVar23, local_a828 != uVar3; uVar3 = uVar3 + 1) {
            printf("  %-2d ",(ulong)uVar3);
          }
          putchar(10);
          for (uVar11 = 0; uVar11 != local_a890; uVar11 = uVar11 + 1) {
            printf(" %-2d  ",uVar11 & 0xffffffff);
            local_a8e8 = uVar11;
            for (paiVar23 = (int (*) [102])0x0; paiVar23 != local_a878;
                paiVar23 = (int (*) [102])((long)*paiVar23 + 1)) {
              uVar3 = Me[(long)paiVar23][uVar11];
              local_a908 = (int (*) [102])(ulong)uVar3;
              iVar2 = (int)local_a900;
              bVar1 = false;
              local_a8f0 = paiVar23;
              for (uVar28 = 0; uVar11 = local_a8e8, paiVar23 = local_a8f0, uVar28 != local_a8b4;
                  uVar28 = uVar28 + 1) {
                iVar19 = (int)local_a908;
                for (iVar4 = 0; (int)local_a868 != iVar4; iVar4 = iVar4 + 1) {
                  iVar5 = Bmc_MeshVarValue2(s,uVar28 + iVar19);
                  if ((iVar5 != 0) &&
                     (iVar5 = Bmc_MeshVarValue2(s,iVar4 + uVar3 + iVar2), iVar5 != 0)) {
                    printf(" %c%-2d ",(ulong)(iVar4 + 0x61),(ulong)uVar28);
                    bVar1 = true;
                  }
                }
              }
              if (!bVar1) {
                pcVar27 = "     ";
                if ((local_a8f0 == local_a898 || local_a8e8 == 0) || local_a8e8 == local_a8a0) {
                  pcVar27 = "  *  ";
                }
                if (local_a8f0 == (int (*) [102])0x0) {
                  pcVar27 = "  *  ";
                }
                printf(pcVar27);
              }
            }
            putchar(10);
          }
        }
      }
      sat_solver_delete(s);
      return;
    }
  }
  __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                ,0x79,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
}

Assistant:

void Bmc_MeshTest2( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
//    sat_solver * pSat = satoko_create();
    sat_solver * pSat = sat_solver_new();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );
                assert( pN[g][0] <  g && pN[g][1] <  g );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//            satoko_destroy( pSat );
            sat_solver_delete( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
//        status = satoko_solve( pSat );
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
//        if ( status == SATOKO_UNSAT )
        if ( status == l_False )
        {
            printf( "Problem has no solution. " );
            break;
        }
//        if ( status == SATOKO_UNDEC )
        if ( status == l_Undef )
        {
            printf( "Computation timed out. " );
            break;
        }
//        assert( status == SATOKO_SAT );
        assert( status == l_True );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
//        iVar = satoko_varnum(pSat);
        iVar = sat_solver_nvars(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue2(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    if ( status == SATOKO_SAT )
    if ( status == l_True )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue2(pSat, iTVar+t) && Bmc_MeshVarValue2(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    //satoko_destroy( pSat );
    sat_solver_delete( pSat );
}